

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_emit_x86.h
# Opt level: O2

void emit_rma(ASMState *as,x86Op xo,Reg rr,void *addr)

{
  MCode *p;
  byte *pbVar1;
  MCode *pMVar2;
  int iVar3;
  lua_State **pplVar4;
  uint uVar5;
  long lVar6;
  Reg rb;
  MCode MVar7;
  byte bVar8;
  Reg RStack_40;
  
  pplVar4 = &as->J[1].L;
  lVar6 = (long)addr - (long)pplVar4;
  if ((int)lVar6 == lVar6) {
    RStack_40 = 0xe;
  }
  else {
    pMVar2 = as->mcp;
    lVar6 = (long)addr - (long)pMVar2;
    if (((int)lVar6 != lVar6) || ((ulong)((long)addr + (0x80000000 - (long)as->mctop)) >> 0x20 != 0)
       ) {
      if ((long)addr + 0x80000000U >> 0x20 == 0) {
        *(int *)(pMVar2 + -4) = (int)addr;
        pMVar2[-5] = '%';
        pMVar2[-6] = (char)rr * '\b' & 0x38U | 4;
        iVar3 = xo << 0x18;
        if (iVar3 == -0x3c000000) {
          *(x86Op *)(pMVar2 + -10) = (rr & 8) << 0xc ^ xo;
          pbVar1 = pMVar2 + -10;
        }
        else {
          *(x86Op *)(pMVar2 + -10) = xo;
          lVar6 = (long)(iVar3 >> 0x18);
          pbVar1 = pMVar2 + lVar6 + -5;
          uVar5 = rr >> 1 & 0x104;
          if (uVar5 != 0) {
            bVar8 = (byte)(rr >> 0x10) | (byte)uVar5 | 0x40;
            if (iVar3 == -0x4000000) {
              *pbVar1 = bVar8;
              bVar8 = (byte)(xo >> 8);
            }
            else if ((xo & 0xffffff) == 0x6600fd) {
              *pbVar1 = bVar8;
              bVar8 = 0x66;
            }
            pMVar2[lVar6 + -6] = bVar8;
            pbVar1 = pMVar2 + lVar6 + -6;
          }
        }
        as->mcp = pbVar1;
        return;
      }
      if (xo == XO_MOV) {
        rb = rr & 0xf;
      }
      else {
        if (xo == XO_GROUP3b) {
          as->mcp = pMVar2 + 1;
          MVar7 = *pMVar2;
          pMVar2 = pMVar2 + 1;
        }
        else {
          MVar7 = '\0';
        }
        if ((ulong)pplVar4 >> 0x20 == 0) {
          emit_loadi(as,0xe,(int32_t)pplVar4);
        }
        else {
          *(lua_State ***)(pMVar2 + -8) = pplVar4;
          pMVar2[-10] = 'I';
          pMVar2[-9] = 0xbe;
          as->mcp = pMVar2 + -10;
        }
        rb = 0xe;
        if (xo == XO_GROUP3b) {
          pMVar2 = as->mcp;
          as->mcp = pMVar2 + -1;
          pMVar2[-1] = MVar7;
        }
      }
      emit_rmro(as,xo,rr,rb,0);
      emit_loadu64(as,rb,(uint64_t)addr);
      return;
    }
    RStack_40 = 0x25;
  }
  emit_rmro(as,xo,rr,RStack_40,(int32_t)lVar6);
  return;
}

Assistant:

static void emit_rma(ASMState *as, x86Op xo, Reg rr, const void *addr)
{
#if LJ_GC64
  if (checki32(dispofs(as, addr))) {
    emit_rmro(as, xo, rr, RID_DISPATCH, (int32_t)dispofs(as, addr));
  } else if (checki32(mcpofs(as, addr)) && checki32(mctopofs(as, addr))) {
    emit_rmro(as, xo, rr, RID_RIP, (int32_t)mcpofs(as, addr));
  } else if (!checki32((intptr_t)addr)) {
    Reg ra = (rr & 15);
    if (xo != XO_MOV) {
      /* We can't allocate a register here. Use and restore DISPATCH. Ugly. */
      uint64_t dispaddr = (uintptr_t)J2GG(as->J)->dispatch;
      uint8_t i8 = xo == XO_GROUP3b ? *as->mcp++ : 0;
      ra = RID_DISPATCH;
      if (checku32(dispaddr)) {
	emit_loadi(as, ra, (int32_t)dispaddr);
      } else {  /* Full-size 64 bit load. */
	MCode *p = as->mcp;
	*(uint64_t *)(p-8) = dispaddr;
	p[-9] = (MCode)(XI_MOVri+(ra&7));
	p[-10] = 0x48 + ((ra>>3)&1);
	p -= 10;
	as->mcp = p;
      }
      if (xo == XO_GROUP3b) emit_i8(as, i8);
    }
    emit_rmro(as, xo, rr, ra, 0);
    emit_loadu64(as, ra, (uintptr_t)addr);
  } else
#endif
  {
    MCode *p = as->mcp;
    *(int32_t *)(p-4) = ptr2addr(addr);
#if LJ_64
    p[-5] = MODRM(XM_SCALE1, RID_ESP, RID_EBP);
    as->mcp = emit_opm(xo, XM_OFS0, rr, RID_ESP, p, -5);
#else
    as->mcp = emit_opm(xo, XM_OFS0, rr, RID_EBP, p, -4);
#endif
  }
}